

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O2

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeLinear>::~TPZCompElHDivCollapsed
          (TPZCompElHDivCollapsed<pzshape::TPZShapeLinear> *this,void **vtt)

{
  void *pvVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  TPZGeoEl *pTVar5;
  TPZConnect *pTVar6;
  long *plVar7;
  int64_t iVar8;
  long lVar9;
  bool bVar10;
  TPZCompElSide celsidesmall;
  TPZGeoElSide gelside;
  TPZCompElSide largecel;
  TPZGeoElSide gelsidesmall;
  TPZStack<TPZCompElSide,_10> celstack;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZCompElHDiv<pzshape::TPZShapeLinear>).
             super_TPZIntelGen<pzshape::TPZShapeLinear>.super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)((long)(this->super_TPZCompElHDiv<pzshape::TPZShapeLinear>).fSideOrient.fExtAlloc +
            *(long *)((long)pvVar1 + -0x60) + -0x68) = vtt[0xb];
  pTVar5 = TPZCompEl::Reference((TPZCompEl *)this);
  if ((pTVar5 != (TPZGeoEl *)0x0) &&
     ((TPZCompElHDivCollapsed<pzshape::TPZShapeLinear> *)pTVar5->fReference == this)) {
    gelside.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
    gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
    gelside.fSide = 2;
    TPZStack<TPZCompElSide,_10>::TPZStack(&celstack);
    TPZGeoElSide::LowerLevelCompElementList2((TPZGeoElSide *)&largecel,(int)&gelside);
    if (largecel.fEl != (TPZCompEl *)0x0) {
      uVar2 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeLinear>).
                                     super_TPZIntelGen<pzshape::TPZShapeLinear>.
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x250))(this,0,2);
      pTVar6 = (TPZConnect *)
               (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeLinear>).
                                      super_TPZIntelGen<pzshape::TPZShapeLinear>.
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0xa8))(this,uVar2);
      TPZConnect::RemoveDepend(pTVar6);
    }
    TPZGeoElSide::HigherLevelCompElementList3(&gelside,&celstack,0,1);
    iVar8 = celstack.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements;
    if (celstack.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements < 1) {
      iVar8 = 0;
    }
    lVar9 = 8;
    while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
      celsidesmall.fEl =
           *(TPZCompEl **)
            ((long)celstack.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore
            + lVar9 + -8);
      celsidesmall.fSide =
           *(int *)((long)&(celstack.super_TPZManVector<TPZCompElSide,_10>.
                            super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar9);
      TPZCompElSide::Reference(&gelsidesmall,&celsidesmall);
      iVar3 = TPZGeoElSide::Dimension(&gelsidesmall);
      iVar4 = (**(code **)(*(long *)pTVar5 + 0x210))(pTVar5);
      if (iVar3 == iVar4) {
        if (celsidesmall.fEl == (TPZCompEl *)0x0) {
LAB_0102b6d8:
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHDivCollapsed.cpp"
                     ,0x8c);
        }
        plVar7 = (long *)__dynamic_cast(celsidesmall.fEl,&TPZCompEl::typeinfo,
                                        &TPZInterpolatedElement::typeinfo,0);
        if (plVar7 == (long *)0x0) goto LAB_0102b6d8;
        uVar2 = (**(code **)(*plVar7 + 0x250))(plVar7,0,celsidesmall.fSide);
        pTVar6 = (TPZConnect *)(**(code **)(*plVar7 + 0xa8))(plVar7,uVar2);
        TPZConnect::RemoveDepend(pTVar6);
      }
      lVar9 = lVar9 + 0x10;
    }
    pTVar5->fReference = (TPZCompEl *)0x0;
    TPZManVector<TPZCompElSide,_10>::~TPZManVector(&celstack.super_TPZManVector<TPZCompElSide,_10>);
  }
  TPZCompElHDiv<pzshape::TPZShapeLinear>::~TPZCompElHDiv
            (&this->super_TPZCompElHDiv<pzshape::TPZShapeLinear>,vtt + 1);
  return;
}

Assistant:

TPZCompElHDivCollapsed<TSHAPE>::~TPZCompElHDivCollapsed(){
    TPZGeoEl *gel = this->Reference();
    if(!gel) return;
    if (gel && gel->Reference() != this) {
        return;
    }
    int side = TSHAPE::NSides-1;
    TPZGeoElSide gelside(this->Reference(),side);
    TPZStack<TPZCompElSide> celstack;
    TPZCompElSide largecel = gelside.LowerLevelCompElementList2(0);
    if (largecel) {
        int cindex = this->SideConnectLocId(0, side);
        TPZConnect &c = this->Connect(cindex);
        c.RemoveDepend();
    }
    gelside.HigherLevelCompElementList3(celstack, 0, 1);
    int64_t ncel = celstack.size();
    for (int64_t el=0; el<ncel; el++) {
        TPZCompElSide celsidesmall = celstack[el];
        TPZGeoElSide gelsidesmall = celsidesmall.Reference();
        if (gelsidesmall.Dimension() != gel->Dimension()) {
            continue;
        }
        TPZCompEl *cel = celsidesmall.Element();
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
        if (!intel) {
            DebugStop();
        }
        int cindex = intel->SideConnectLocId(0, celsidesmall.Side());
        TPZConnect &c = intel->Connect(cindex);
        c.RemoveDepend();
    }
    if (gel){
        gel->ResetReference();
    }

}